

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::formatter<void*,char,void>::
parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
          (formatter<void*,char,void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  char *pcVar1;
  error_handler eh;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  handler;
  error_handler local_31;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  local_30;
  
  local_30.arg_type_ = pointer_type;
  pcVar1 = (ctx->format_str_).data_;
  local_30.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .super_specs_setter<char>.specs_ = (basic_format_specs<char> *)this;
  local_30.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .specs_ = (dynamic_format_specs<char> *)this;
  local_30.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  .context_ = ctx;
  pcVar1 = internal::
           parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                     (pcVar1,pcVar1 + (ctx->format_str_).size_,&local_30);
  internal::check_pointer_type_spec<char,fmt::v5::internal::error_handler&>
            ((char)this[0x11],&local_31);
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR typename ParseContext::iterator parse(ParseContext &ctx) {
    typedef internal::dynamic_specs_handler<ParseContext> handler_type;
    auto type = internal::get_type<
      typename buffer_context<Char>::type, T>::value;
    internal::specs_checker<handler_type>
        handler(handler_type(specs_, ctx), type);
    auto it = parse_format_specs(ctx.begin(), ctx.end(), handler);
    auto type_spec = specs_.type;
    auto eh = ctx.error_handler();
    switch (type) {
    case internal::none_type:
    case internal::named_arg_type:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case internal::int_type:
    case internal::uint_type:
    case internal::long_long_type:
    case internal::ulong_long_type:
    case internal::bool_type:
      handle_int_type_spec(
            type_spec, internal::int_type_checker<decltype(eh)>(eh));
      break;
    case internal::char_type:
      handle_char_specs(
          &specs_,
          internal::char_specs_checker<decltype(eh)>(type_spec, eh));
      break;
    case internal::double_type:
    case internal::long_double_type:
      handle_float_type_spec(
            type_spec, internal::float_type_checker<decltype(eh)>(eh));
      break;
    case internal::cstring_type:
      internal::handle_cstring_type_spec(
            type_spec, internal::cstring_type_checker<decltype(eh)>(eh));
      break;
    case internal::string_type:
      internal::check_string_type_spec(type_spec, eh);
      break;
    case internal::pointer_type:
      internal::check_pointer_type_spec(type_spec, eh);
      break;
    case internal::custom_type:
      // Custom format specifiers should be checked in parse functions of
      // formatter specializations.
      break;
    }
    return it;
  }